

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<llvm::DWARFDebugNames::NameIndex,_0U>::~SmallVector
          (SmallVector<llvm::DWARFDebugNames::NameIndex,_0U> *this)

{
  iterator S;
  iterator E;
  SmallVector<llvm::DWARFDebugNames::NameIndex,_0U> *this_local;
  
  S = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::begin
                ((SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void> *)this);
  E = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::end
                ((SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void> *)this);
  SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::destroy_range(S,E);
  SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>::~SmallVectorImpl
            (&this->super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }